

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

UniValue *
DetailMaybeArg(CheckFn *check,vector<RPCArg,_std::allocator<RPCArg>_> *params,JSONRPCRequest *req,
              size_t i)

{
  pointer pRVar1;
  ulong uVar2;
  JSONRPCRequest **ppJVar3;
  UniValue *pUVar4;
  RPCArg *pRVar5;
  long in_FS_OFFSET;
  bool local_41;
  JSONRPCRequest *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = ((long)(params->super__Vector_base<RPCArg,_std::allocator<RPCArg>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(params->super__Vector_base<RPCArg,_std::allocator<RPCArg>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3) * 0xf83e0f83e0f83e1;
  local_41 = i <= uVar2 && uVar2 - i != 0;
  local_40 = req;
  inline_check_non_fatal<bool>
            (&local_41,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp"
             ,0x2b8,"DetailMaybeArg","i < params.size()");
  ppJVar3 = inline_check_non_fatal<JSONRPCRequest_const*&>
                      (&local_40,
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp"
                       ,0x2b9,"DetailMaybeArg","req");
  pUVar4 = UniValue::operator[](&(*ppJVar3)->params,i);
  pRVar1 = (params->super__Vector_base<RPCArg,_std::allocator<RPCArg>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = ((long)(params->super__Vector_base<RPCArg,_std::allocator<RPCArg>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pRVar1 >> 3) * 0xf83e0f83e0f83e1;
  if (uVar2 < i || uVar2 - i == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",i);
    }
  }
  else {
    pRVar5 = pRVar1 + i;
    if (check != (CheckFn *)0x0) {
      (*check)(pRVar5);
    }
    if (pUVar4->typ == VNULL) {
      if (*(__index_type *)
           ((long)&(pRVar5->m_fallback).
                   super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                   .
                   super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
                   .
                   super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
                   .
                   super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
                   .
                   super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
           + 0x58) == '\x02') {
        pUVar4 = std::get<2ul,RPCArg::Optional,std::__cxx11::string,UniValue>(&pRVar5->m_fallback);
      }
      else {
        pUVar4 = (UniValue *)0x0;
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return pUVar4;
    }
  }
  __stack_chk_fail();
}

Assistant:

static const UniValue* DetailMaybeArg(CheckFn* check, const std::vector<RPCArg>& params, const JSONRPCRequest* req, size_t i)
{
    CHECK_NONFATAL(i < params.size());
    const UniValue& arg{CHECK_NONFATAL(req)->params[i]};
    const RPCArg& param{params.at(i)};
    if (check) check(param);

    if (!arg.isNull()) return &arg;
    if (!std::holds_alternative<RPCArg::Default>(param.m_fallback)) return nullptr;
    return &std::get<RPCArg::Default>(param.m_fallback);
}